

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O2

void __thiscall JitFFI::SysV64::ArgOPCounter::add(ArgOPCounter *this,OP type)

{
  uint uVar1;
  undefined7 in_register_00000031;
  
  uVar1 = (uint)CONCAT71(in_register_00000031,type);
  if (1 < uVar1) {
    if (uVar1 == 3) {
      this = (ArgOPCounter *)&this->memory_count;
    }
    else {
      if (uVar1 != 2) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                      ,0x244,"void JitFFI::SysV64::ArgOPCounter::add(ArgTypeInfo::OP)");
      }
      this = (ArgOPCounter *)&this->float_count;
    }
  }
  this->int_count = this->int_count + 1;
  return;
}

Assistant:

void add(ArgTypeInfo::OP type) {
				switch (type) {
				case ArgTypeInfo::op_void: int_count++; break;
				case ArgTypeInfo::op_int: int_count++; break;
				case ArgTypeInfo::op_float: float_count++; break;
				case ArgTypeInfo::op_memory: memory_count++; break;
				default: assert(false);
				}
			}